

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O0

void Saig_ManCexMinDerivePhasePriority_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int b;
  Aig_Obj_t *pAVar5;
  int iPrio1;
  int iPrio0;
  int fPhase1;
  int fPhase0;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(pAig,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(pAig,pObj);
    iVar1 = Aig_ObjIsCo(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsNode(pObj);
      if (iVar1 != 0) {
        pAVar5 = Aig_ObjFanin0(pObj);
        Saig_ManCexMinDerivePhasePriority_rec(pAig,pAVar5);
        pAVar5 = Aig_ObjFanin1(pObj);
        Saig_ManCexMinDerivePhasePriority_rec(pAig,pAVar5);
        pAVar5 = Aig_ObjFanin0(pObj);
        if ((pAVar5->field_5).iData < 0) {
          __assert_fail("Aig_ObjFanin0(pObj)->iData >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                        ,0x98,"void Saig_ManCexMinDerivePhasePriority_rec(Aig_Man_t *, Aig_Obj_t *)"
                       );
        }
        pAVar5 = Aig_ObjFanin1(pObj);
        if ((pAVar5->field_5).iData < 0) {
          __assert_fail("Aig_ObjFanin1(pObj)->iData >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                        ,0x99,"void Saig_ManCexMinDerivePhasePriority_rec(Aig_Man_t *, Aig_Obj_t *)"
                       );
        }
        pAVar5 = Aig_ObjFanin0(pObj);
        uVar2 = Abc_LitIsCompl((pAVar5->field_5).iData);
        uVar3 = Aig_ObjFaninC0(pObj);
        uVar2 = uVar2 ^ uVar3;
        pAVar5 = Aig_ObjFanin1(pObj);
        uVar4 = Abc_LitIsCompl((pAVar5->field_5).iData);
        uVar3 = Aig_ObjFaninC1(pObj);
        uVar4 = uVar4 ^ uVar3;
        pAVar5 = Aig_ObjFanin0(pObj);
        iVar1 = Abc_Lit2Var((pAVar5->field_5).iData);
        pAVar5 = Aig_ObjFanin1(pObj);
        b = Abc_Lit2Var((pAVar5->field_5).iData);
        if ((uVar2 == 0) || (uVar4 == 0)) {
          if ((uVar2 == 0) && (uVar4 != 0)) {
            iVar1 = Abc_Var2Lit(iVar1,0);
            (pObj->field_5).iData = iVar1;
          }
          else if ((uVar2 == 0) || (uVar4 != 0)) {
            iVar1 = Abc_MaxInt(iVar1,b);
            iVar1 = Abc_Var2Lit(iVar1,0);
            (pObj->field_5).iData = iVar1;
          }
          else {
            iVar1 = Abc_Var2Lit(b,0);
            (pObj->field_5).iData = iVar1;
          }
        }
        else {
          iVar1 = Abc_MinInt(iVar1,b);
          iVar1 = Abc_Var2Lit(iVar1,1);
          (pObj->field_5).iData = iVar1;
        }
      }
    }
    else {
      pAVar5 = Aig_ObjFanin0(pObj);
      Saig_ManCexMinDerivePhasePriority_rec(pAig,pAVar5);
      pAVar5 = Aig_ObjFanin0(pObj);
      if ((pAVar5->field_5).iData < 0) {
        __assert_fail("Aig_ObjFanin0(pObj)->iData >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                      ,0x90,"void Saig_ManCexMinDerivePhasePriority_rec(Aig_Man_t *, Aig_Obj_t *)");
      }
      pAVar5 = Aig_ObjFanin0(pObj);
      uVar3 = (pAVar5->field_5).iData;
      uVar2 = Aig_ObjFaninC0(pObj);
      (pObj->field_5).iData = uVar3 ^ uVar2;
    }
  }
  return;
}

Assistant:

void Saig_ManCexMinDerivePhasePriority_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManCexMinDerivePhasePriority_rec( pAig, Aig_ObjFanin0(pObj) );
        assert( Aig_ObjFanin0(pObj)->iData >= 0 );
        pObj->iData = Aig_ObjFanin0(pObj)->iData ^ Aig_ObjFaninC0(pObj);
    }
    else if ( Aig_ObjIsNode(pObj) )
    {
        int fPhase0, fPhase1, iPrio0, iPrio1;
        Saig_ManCexMinDerivePhasePriority_rec( pAig, Aig_ObjFanin0(pObj) );
        Saig_ManCexMinDerivePhasePriority_rec( pAig, Aig_ObjFanin1(pObj) );
        assert( Aig_ObjFanin0(pObj)->iData >= 0 );
        assert( Aig_ObjFanin1(pObj)->iData >= 0 );
        fPhase0 = Abc_LitIsCompl( Aig_ObjFanin0(pObj)->iData ) ^ Aig_ObjFaninC0(pObj);
        fPhase1 = Abc_LitIsCompl( Aig_ObjFanin1(pObj)->iData ) ^ Aig_ObjFaninC1(pObj);
        iPrio0  = Abc_Lit2Var( Aig_ObjFanin0(pObj)->iData );
        iPrio1  = Abc_Lit2Var( Aig_ObjFanin1(pObj)->iData );
        if ( fPhase0 && fPhase1 ) // both are one
            pObj->iData = Abc_Var2Lit( Abc_MinInt(iPrio0, iPrio1), 1 );
        else if ( !fPhase0 && fPhase1 ) 
            pObj->iData = Abc_Var2Lit( iPrio0, 0 );
        else if ( fPhase0 && !fPhase1 )
            pObj->iData = Abc_Var2Lit( iPrio1, 0 );
        else // both are zero
            pObj->iData = Abc_Var2Lit( Abc_MaxInt(iPrio0, iPrio1), 0 );
    }
}